

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_dx_iface.c
# Opt level: O3

aom_codec_err_t decoder_destroy(aom_codec_alg_priv_t *ctx)

{
  AV1_COMMON *cm;
  AVxWorker *pAVar1;
  undefined8 *memblk;
  AV1Decoder *pbi_00;
  AVxWorkerInterface *pAVar2;
  BufferPool *pool;
  aom_codec_frame_buffer_t *paVar3;
  AV1Decoder *pbi;
  ulong uVar4;
  
  pAVar1 = ctx->frame_worker;
  if (pAVar1 != (AVxWorker *)0x0) {
    pAVar2 = aom_get_worker_interface();
    (*pAVar2->end)(pAVar1);
    memblk = (undefined8 *)pAVar1->data1;
    if ((memblk != (undefined8 *)0x0) &&
       (pbi_00 = (AV1Decoder *)*memblk, pbi_00 != (AV1Decoder *)0x0)) {
      cm = &pbi_00->common;
      aom_free((pbi_00->common).tpl_mvs);
      (pbi_00->common).tpl_mvs = (TPL_MV_REF *)0x0;
      av1_remove_common(cm);
      av1_free_cdef_buffers(cm,&pbi_00->cdef_worker,&pbi_00->cdef_sync);
      av1_free_cdef_sync(&pbi_00->cdef_sync);
      av1_free_restoration_buffers(cm);
      av1_decoder_remove(pbi_00);
    }
    aom_free(memblk);
  }
  pool = ctx->buffer_pool;
  if (pool != (BufferPool *)0x0) {
    if (ctx->num_grain_image_frame_buffers != 0) {
      paVar3 = ctx->grain_image_frame_buffers;
      uVar4 = 0;
      do {
        (*ctx->buffer_pool->release_fb_cb)(ctx->buffer_pool->cb_priv,paVar3);
        uVar4 = uVar4 + 1;
        paVar3 = paVar3 + 1;
      } while (uVar4 < ctx->num_grain_image_frame_buffers);
      pool = ctx->buffer_pool;
    }
    av1_free_ref_frame_buffers(pool);
    av1_free_internal_frame_buffers(&ctx->buffer_pool->int_frame_buffers);
    pthread_mutex_destroy((pthread_mutex_t *)ctx->buffer_pool);
  }
  aom_free(ctx->frame_worker);
  aom_free(ctx->buffer_pool);
  aom_img_free(&ctx->img);
  aom_free(ctx);
  return AOM_CODEC_OK;
}

Assistant:

static aom_codec_err_t decoder_destroy(aom_codec_alg_priv_t *ctx) {
  if (ctx->frame_worker != NULL) {
    AVxWorker *const worker = ctx->frame_worker;
    aom_get_worker_interface()->end(worker);
    FrameWorkerData *const frame_worker_data = (FrameWorkerData *)worker->data1;
    if (frame_worker_data != NULL && frame_worker_data->pbi != NULL) {
      AV1Decoder *const pbi = frame_worker_data->pbi;
      aom_free(pbi->common.tpl_mvs);
      pbi->common.tpl_mvs = NULL;
      av1_remove_common(&pbi->common);
      av1_free_cdef_buffers(&pbi->common, &pbi->cdef_worker, &pbi->cdef_sync);
      av1_free_cdef_sync(&pbi->cdef_sync);
      av1_free_restoration_buffers(&pbi->common);
      av1_decoder_remove(pbi);
    }
    aom_free(frame_worker_data);
  }

  if (ctx->buffer_pool) {
    for (size_t i = 0; i < ctx->num_grain_image_frame_buffers; i++) {
      ctx->buffer_pool->release_fb_cb(ctx->buffer_pool->cb_priv,
                                      &ctx->grain_image_frame_buffers[i]);
    }
    av1_free_ref_frame_buffers(ctx->buffer_pool);
    av1_free_internal_frame_buffers(&ctx->buffer_pool->int_frame_buffers);
#if CONFIG_MULTITHREAD
    pthread_mutex_destroy(&ctx->buffer_pool->pool_mutex);
#endif
  }

  aom_free(ctx->frame_worker);
  aom_free(ctx->buffer_pool);
  assert(!ctx->img.self_allocd);
  aom_img_free(&ctx->img);
  aom_free(ctx);
  return AOM_CODEC_OK;
}